

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::CPrimitiveMode::
IsGeometryShaderSupported<glcts::(anonymous_namespace)::test_api::ES3>(CPrimitiveMode *this)

{
  Context *pCVar1;
  ContextInfo *this_00;
  bool bVar2;
  ContextType ctxType;
  allocator<char> local_41;
  string local_40;
  
  pCVar1 = (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context;
  this_00 = pCVar1->m_contextInfo;
  ctxType.super_ApiType.m_bits = (ApiType)(*pCVar1->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar2) {
    return true;
  }
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x13);
  if (bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (bVar2) {
      return true;
    }
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_geometry_shader");
    if (bVar2) {
      return true;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Geometry shader is not supported\n",&local_41);
  deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

bool IsGeometryShaderSupported()
	{
		if (api::isES())
		{
			const glu::ContextInfo& info = m_context.getContextInfo();
			const glu::ContextType& type = m_context.getRenderContext().getType();

			/* ES 3.2+ included geometry shaders into the core */
			if (glu::contextSupports(type, glu::ApiType(3, 2, glu::PROFILE_ES)))
			{
				return true;
			}
			/* ES 3.1 may be able to support geometry shaders via extensions */
			else if ((glu::contextSupports(type, glu::ApiType(3, 1, glu::PROFILE_ES))) &&
					 ((true == info.isExtensionSupported("GL_EXT_geometry_shader")) ||
					  (true == info.isExtensionSupported("GL_OES_geometry_shader"))))
			{
				return true;
			}
			else
			{
				OutputNotSupported("Geometry shader is not supported\n");
				return false;
			}
		}
		else
		{
			return true;
		}
	}